

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O3

void __thiscall
Deck::discard(Deck *this,Hand *hand,vector<CardType,_std::allocator<CardType>_> *discardedCards)

{
  pointer pCVar1;
  pointer pCVar2;
  pointer pCVar3;
  vector<CardType,std::allocator<CardType>> *this_00;
  iterator __position;
  vector<CardType,_std::allocator<CardType>_> *pvVar4;
  bool bVar5;
  ulong uVar6;
  length_error *this_01;
  CardType *__args;
  pointer pCVar7;
  long lVar8;
  pointer pCVar9;
  ulong uVar10;
  ulong uVar11;
  int i;
  ulong uVar12;
  
  pCVar1 = (hand->handPointer->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar2 = (hand->handPointer->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = 0;
  uVar12 = 0;
  do {
    pCVar3 = (discardedCards->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(discardedCards->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pCVar3 >> 2;
    if (uVar6 <= uVar12) {
LAB_00115c65:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar12,
                 uVar6);
    }
    this_00 = (vector<CardType,std::allocator<CardType>> *)this->discardPointer;
    __args = (CardType *)((long)pCVar3 + lVar8);
    __position._M_current = *(CardType **)(this_00 + 8);
    if (__position._M_current == *(CardType **)(this_00 + 0x10)) {
      std::vector<CardType,std::allocator<CardType>>::_M_realloc_insert<CardType_const&>
                (this_00,__position,__args);
    }
    else {
      *__position._M_current = *__args;
      *(CardType **)(this_00 + 8) = __position._M_current + 1;
    }
    uVar12 = uVar12 + 1;
    lVar8 = lVar8 + 4;
  } while (uVar12 != 3);
  uVar12 = 0;
  do {
    pvVar4 = hand->handPointer;
    pCVar3 = (pvVar4->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pCVar7 = (pvVar4->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pCVar7 - (long)pCVar3 != 0) {
      pCVar9 = (discardedCards->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = (long)(discardedCards->super__Vector_base<CardType,_std::allocator<CardType>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pCVar9 >> 2;
      uVar10 = 0;
      uVar11 = 1;
      do {
        if (uVar6 <= uVar12) goto LAB_00115c65;
        if (pCVar3[uVar10] == pCVar9[uVar12]) {
          pCVar9 = pCVar3 + uVar10 + 1;
          if (pCVar9 != pCVar7) {
            memmove(pCVar3 + uVar10,pCVar9,(long)pCVar7 - (long)pCVar9);
            pCVar7 = (pvVar4->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          (pvVar4->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
          super__Vector_impl_data._M_finish = pCVar7 + -1;
          break;
        }
        bVar5 = uVar11 < (ulong)((long)pCVar7 - (long)pCVar3 >> 2);
        uVar10 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar5);
    }
    uVar12 = uVar12 + 1;
    if (uVar12 == 3) {
      if ((long)(hand->handPointer->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(hand->handPointer->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl
                .super__Vector_impl_data._M_start >> 2 ==
          ((ulong)((long)pCVar1 - (long)pCVar2) >> 2 & 0xffffffff)) {
        this_01 = (length_error *)__cxa_allocate_exception(0x10);
        std::length_error::length_error
                  (this_01,
                   "The three cards were not removed from the hand once exchanged successfully. System exiting."
                  );
        __cxa_throw(this_01,&std::length_error::typeinfo,std::length_error::~length_error);
      }
      return;
    }
  } while( true );
}

Assistant:

void Deck::discard(Hand* hand, std::vector<CardType> discardedCards) {

    unsigned int initialHandSize = hand->getHand()->size();

    for (int i = 0; i < 3; i++) {
        Deck::discardPointer->push_back(discardedCards.at(i));
    }

    for (int i = 0; i < 3; i++) {
        unsigned int counter = 0; // position in vector
        int removedCard = 0;

        while (removedCard == 0 && counter <
                                   hand->getHand()->size()) { //stop once the vector has been gone through completely or a card was removed
            if (hand->getHand()->at(counter) == discardedCards.at(i)) {
                hand->getHand()->erase(hand->getHand()->begin() + counter);
                removedCard = 1;
            } else {
                counter++;
            }
        }
    }

    // checks if the cards were removed from the hand as expected
    if (hand->getHand()->size() == initialHandSize) {
        throw std::length_error(
                "The three cards were not removed from the hand once exchanged successfully. System exiting.");
    }
}